

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O1

locale __thiscall
booster::locale::impl_std::create_collate
          (impl_std *this,locale *in,string *locale_name,character_facet_type type,utf8_support utf)

{
  locale *__other;
  collate_byname<wchar_t> *pcVar1;
  utf8_collator_from_wide *__f;
  collate_byname<char> *__f_00;
  locale base;
  locale local_30;
  
  if (type == 2) {
    pcVar1 = (collate_byname<wchar_t> *)operator_new(0x18);
    std::__cxx11::collate_byname<wchar_t>::collate_byname
              ((char *)pcVar1,(ulong)(locale_name->_M_dataplus)._M_p);
    std::locale::locale<std::__cxx11::collate_byname<wchar_t>>((locale *)this,in,pcVar1);
  }
  else if (type == 1) {
    if (utf == utf8_from_wide) {
      __other = (locale *)std::locale::classic();
      pcVar1 = (collate_byname<wchar_t> *)operator_new(0x18);
      std::__cxx11::collate_byname<wchar_t>::collate_byname
                ((char *)pcVar1,(ulong)(locale_name->_M_dataplus)._M_p);
      std::locale::locale<std::__cxx11::collate_byname<wchar_t>>(&local_30,__other,pcVar1);
      __f = (utf8_collator_from_wide *)operator_new(0x20);
      std::__cxx11::collate<char>::collate((ulong)__f);
      *(undefined ***)__f = &PTR__utf8_collator_from_wide_001d2d18;
      std::locale::locale(&__f->base_,&local_30);
      std::locale::locale<booster::locale::impl_std::utf8_collator_from_wide>((locale *)this,in,__f)
      ;
      std::locale::~locale(&local_30);
    }
    else {
      __f_00 = (collate_byname<char> *)operator_new(0x18);
      std::__cxx11::collate_byname<char>::collate_byname
                ((char *)__f_00,(ulong)(locale_name->_M_dataplus)._M_p);
      std::locale::locale<std::__cxx11::collate_byname<char>>((locale *)this,in,__f_00);
    }
  }
  else {
    std::locale::locale((locale *)this,in);
  }
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_collate( std::locale const &in,
                            std::string const &locale_name,
                            character_facet_type type,
                            utf8_support utf)
{
    switch(type) {
    case char_facet:
        {
            if(utf == utf8_from_wide) {
                std::locale base=
                    std::locale(std::locale::classic(),
                                new std::collate_byname<wchar_t>(locale_name.c_str()));
                return std::locale(in,new utf8_collator_from_wide(base));
            }
            else
            {
                return std::locale(in,new std::collate_byname<char>(locale_name.c_str()));
            }
        }

    case wchar_t_facet:
        return std::locale(in,new std::collate_byname<wchar_t>(locale_name.c_str()));

    #ifdef BOOSTER_HAS_CHAR16_T
    case char16_t_facet:
        return std::locale(in,new std::collate_byname<char16_t>(locale_name.c_str()));
    #endif

    #ifdef BOOSTER_HAS_CHAR32_T
    case char32_t_facet:
        return std::locale(in,new std::collate_byname<char32_t>(locale_name.c_str()));
    #endif
    default:
        return in;
    }
}